

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O2

void mondied(monst *mdef)

{
  boolean bVar1;
  
  mondead(mdef);
  if ((0 < mdef->mhp) || (bVar1 = corpse_chance(mdef,(monst *)0x0,'\0'), bVar1 == '\0')) {
    return;
  }
  bVar1 = accessible((int)mdef->mx,(int)mdef->my);
  if ((bVar1 == '\0') && (bVar1 = is_pool(level,(int)mdef->mx,(int)mdef->my), bVar1 == '\0')) {
    return;
  }
  make_corpse(mdef);
  return;
}

Assistant:

void mondied(struct monst *mdef)
{
	mondead(mdef);
	if (mdef->mhp > 0) return;	/* lifesaved */

	if (corpse_chance(mdef, NULL, FALSE) &&
	    (accessible(mdef->mx, mdef->my) || is_pool(level, mdef->mx, mdef->my)))
		make_corpse(mdef);
}